

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_set_packing(png_structrp png_ptr)

{
  png_structrp png_ptr_local;
  
  if ((png_ptr != (png_structrp)0x0) && (png_ptr->bit_depth < 8)) {
    png_ptr->transformations = png_ptr->transformations | 4;
    png_ptr->usr_bit_depth = '\b';
  }
  return;
}

Assistant:

void PNGAPI
png_set_packing(png_structrp png_ptr)
{
   png_debug(1, "in png_set_packing");

   if (png_ptr == NULL)
      return;

   if (png_ptr->bit_depth < 8)
   {
      png_ptr->transformations |= PNG_PACK;
#     ifdef PNG_WRITE_SUPPORTED
         png_ptr->usr_bit_depth = 8;
#     endif
   }
}